

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPI_PDU.cpp
# Opt level: O2

KString * __thiscall
KDIS::PDU::TSPI_PDU::GetAsString_abi_cxx11_(KString *__return_storage_ptr__,TSPI_PDU *this)

{
  char *pcVar1;
  byte bVar2;
  ostream *poVar3;
  char *pcVar4;
  KFLOAT32 KVar5;
  KStringStream ss;
  KString KStack_1e8;
  KString local_1c8;
  stringstream local_1a8 [16];
  long local_198 [3];
  uint auStack_180 [88];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  LE_Header::GetAsString_abi_cxx11_(&KStack_1e8,&this->super_LE_Header);
  poVar3 = std::operator<<((ostream *)local_198,(string *)&KStack_1e8);
  poVar3 = std::operator<<(poVar3,"-Time Space Position Information(TSPI) PDU-\n");
  poVar3 = std::operator<<(poVar3,"Optional Field Flags:\n");
  poVar3 = std::operator<<(poVar3,"\tLinear Velocity:          ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tLinear Orientation:       ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag >> 1 & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tPosition Error:           ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag >> 2 & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tOrientation Error:        ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag >> 3 & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tDead Reckoning Parameter: ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag >> 4 & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tMeasured Speed:           ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag >> 5 & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"\tSystem Specific Data:     ");
  poVar3 = (ostream *)std::ostream::operator<<(poVar3,(this->m_TSPIFlagUnion).m_ui8Flag >> 6 & 1);
  poVar3 = std::operator<<(poVar3,"\n");
  poVar3 = std::operator<<(poVar3,"Location - ");
  DATA_TYPE::RelativeWorldCoordinates::GetAsString_abi_cxx11_(&local_1c8,&this->m_Loc);
  std::operator<<(poVar3,(string *)&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::__cxx11::string::~string((string *)&KStack_1e8);
  bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  if ((bVar2 & 1) != 0) {
    poVar3 = std::operator<<((ostream *)local_198,"Linear Velocity:          ");
    DATA_TYPE::LE_Vector<KDIS::DATA_TYPE::KFIXED<short,(unsigned_char)3>>::GetAsString_abi_cxx11_
              (&KStack_1e8,&this->m_LinVel);
    std::operator<<(poVar3,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 2) != 0) {
    poVar3 = std::operator<<((ostream *)local_198,"Linear Orientation:       ");
    DATA_TYPE::LE_EulerAngles::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_Ori);
    std::operator<<(poVar3,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 4) != 0) {
    poVar3 = std::operator<<((ostream *)local_198,"Position Error:           ");
    DATA_TYPE::PositionError::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_PosErr);
    std::operator<<(poVar3,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 8) != 0) {
    poVar3 = std::operator<<((ostream *)local_198,"Orientation Error:        ");
    DATA_TYPE::OrientationError::GetAsString_abi_cxx11_(&KStack_1e8,&this->m_OriErr);
    std::operator<<(poVar3,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x10) != 0) {
    DATA_TYPE::LE_DeadReckoningParameter::GetAsString_abi_cxx11_
              (&KStack_1e8,&this->m_DeadReckoningParameter);
    std::operator<<((ostream *)local_198,(string *)&KStack_1e8);
    std::__cxx11::string::~string((string *)&KStack_1e8);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x20) != 0) {
    poVar3 = std::operator<<((ostream *)local_198,"Measured Speed:           ");
    KVar5 = DATA_TYPE::KFIXED<short,_(unsigned_char)'\x03'>::GetAsFloat32(&this->m_MeasureSpd);
    std::ostream::operator<<(poVar3,(float)KVar5);
    bVar2 = (this->m_TSPIFlagUnion).m_ui8Flag;
  }
  if ((bVar2 & 0x40) != 0) {
    poVar3 = std::operator<<((ostream *)local_198,"System Specific Data:\n");
    poVar3 = std::operator<<(poVar3,"\tData Length: ");
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,(ushort)this->m_ui8SSDLen);
    poVar3 = std::operator<<(poVar3,"\n");
    std::operator<<(poVar3,"\tData: ");
    pcVar1 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pcVar4 = (this->m_vSSD).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start; pcVar4 != pcVar1; pcVar4 = pcVar4 + 1) {
      *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) =
           *(uint *)((long)auStack_180 + *(long *)(local_198[0] + -0x18)) & 0xffffffb5 | 8;
      std::operator<<((ostream *)local_198,*pcVar4);
    }
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

KString TSPI_PDU::GetAsString() const
{
    KStringStream ss;

    ss << LE_Header::GetAsString()
       << "-Time Space Position Information(TSPI) PDU-\n"
       << "Optional Field Flags:\n"
       << "\tLinear Velocity:          " << ( KUINT16 )m_TSPIFlagUnion.m_ui8LinVel << "\n"
       << "\tLinear Orientation:       " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Ori    << "\n"
       << "\tPosition Error:           " << ( KUINT16 )m_TSPIFlagUnion.m_ui8PosErr << "\n"
       << "\tOrientation Error:        " << ( KUINT16 )m_TSPIFlagUnion.m_ui8OriErr << "\n"
       << "\tDead Reckoning Parameter: " << ( KUINT16 )m_TSPIFlagUnion.m_ui8DRM    << "\n"
       << "\tMeasured Speed:           " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Spd    << "\n"
       << "\tSystem Specific Data:     " << ( KUINT16 )m_TSPIFlagUnion.m_ui8Data   << "\n"
       << "Location - "                << m_Loc.GetAsString();

    if( m_TSPIFlagUnion.m_ui8LinVel )
    {
        ss << "Linear Velocity:          " << m_LinVel.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8Ori )
    {
        ss << "Linear Orientation:       " << m_Ori.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8PosErr )
    {
        ss << "Position Error:           " << m_PosErr.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8OriErr )
    {
        ss << "Orientation Error:        " << m_OriErr.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8DRM )
    {
        ss << m_DeadReckoningParameter.GetAsString();
    }

    if( m_TSPIFlagUnion.m_ui8Spd )
    {
        ss << "Measured Speed:           " << m_MeasureSpd.GetAsFloat32();
    }

    if( m_TSPIFlagUnion.m_ui8Data )
    {
        ss  << "System Specific Data:\n"
            << "\tData Length: "    << ( KUINT16 )m_ui8SSDLen << "\n"
            << "\tData: ";

        vector<KOCTET>::const_iterator citr = m_vSSD.begin();
        vector<KOCTET>::const_iterator citrEnd = m_vSSD.end();
        for( ; citr != citrEnd; ++citr )
        {
            ss << hex << *citr;
        }
    }

    return ss.str();
}